

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

bool __thiscall cmCTestSVN::NoteNewRevision(cmCTestSVN *this)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  char *msg;
  ulong uVar3;
  string *psVar4;
  char local_261;
  string local_260;
  string local_240;
  string local_220;
  string local_200 [48];
  ostringstream local_1d0 [8];
  ostringstream cmCTestLog_msg;
  string local_58;
  reference local_38;
  SVNInfo *svninfo;
  iterator __end1;
  iterator __begin1;
  list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_> *__range1;
  cmCTestSVN *this_local;
  
  bVar1 = LoadRepositories(this);
  if (bVar1) {
    __end1 = std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::begin
                       (&this->Repositories);
    svninfo = (SVNInfo *)
              std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::end
                        (&this->Repositories);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&svninfo), bVar1) {
      local_38 = std::_List_iterator<cmCTestSVN::SVNInfo>::operator*(&__end1);
      LoadInfo_abi_cxx11_(&local_58,this,local_38);
      std::__cxx11::string::operator=((string *)&local_38->NewRevision,(string *)&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
                               "Revision for repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' after update: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->NewRevision);
      std::operator<<(poVar2,"\n");
      std::__cxx11::ostringstream::ostringstream(local_1d0);
      poVar2 = std::operator<<((ostream *)local_1d0,"   New revision of external repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' is: ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->NewRevision);
      std::operator<<(poVar2,"\n");
      this_00 = (this->super_cmCTestGlobalVC).super_cmCTestVC.CTest;
      std::__cxx11::ostringstream::str();
      msg = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(this_00,2,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CTest/cmCTestSVN.cxx"
                   ,0x88,msg,false);
      std::__cxx11::string::~string(local_200);
      std::__cxx11::ostringstream::~ostringstream(local_1d0);
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' URL = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->URL);
      std::operator<<(poVar2,"\n");
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' Root = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->Root);
      std::operator<<(poVar2,"\n");
      uVar3 = std::__cxx11::string::empty();
      if (((uVar3 & 1) == 0) &&
         (bVar1 = cmCTestSVNPathStarts(&local_38->URL,&local_38->Root), bVar1)) {
        psVar4 = &local_38->URL;
        std::__cxx11::string::size();
        std::__cxx11::string::substr((ulong)&local_260,(ulong)psVar4);
        cmCTest::DecodeURL(&local_240,&local_260);
        local_261 = '/';
        cmStrCat<std::__cxx11::string,char>(&local_220,&local_240,&local_261);
        std::__cxx11::string::operator=((string *)&local_38->Base,(string *)&local_220);
        std::__cxx11::string::~string((string *)&local_220);
        std::__cxx11::string::~string((string *)&local_240);
        std::__cxx11::string::~string((string *)&local_260);
      }
      poVar2 = std::operator<<((this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"Repository \'");
      poVar2 = std::operator<<(poVar2,(string *)local_38);
      poVar2 = std::operator<<(poVar2,"\' Base = ");
      poVar2 = std::operator<<(poVar2,(string *)&local_38->Base);
      std::operator<<(poVar2,"\n");
      std::_List_iterator<cmCTestSVN::SVNInfo>::operator++(&__end1);
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_cmCTestGlobalVC).NewRevision,
               (string *)&this->RootInfo->NewRevision);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool cmCTestSVN::NoteNewRevision()
{
  if (!this->LoadRepositories()) {
    return false;
  }

  for (SVNInfo& svninfo : this->Repositories) {
    svninfo.NewRevision = this->LoadInfo(svninfo);
    this->Log << "Revision for repository '" << svninfo.LocalPath
              << "' after update: " << svninfo.NewRevision << "\n";
    cmCTestLog(this->CTest, HANDLER_OUTPUT,
               "   New revision of external repository '"
                 << svninfo.LocalPath << "' is: " << svninfo.NewRevision
                 << "\n");

    // svninfo.Root = ""; // uncomment to test GuessBase
    this->Log << "Repository '" << svninfo.LocalPath
              << "' URL = " << svninfo.URL << "\n";
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Root = " << svninfo.Root << "\n";

    // Compute the base path the working tree has checked out under
    // the repository root.
    if (!svninfo.Root.empty() &&
        cmCTestSVNPathStarts(svninfo.URL, svninfo.Root)) {
      svninfo.Base = cmStrCat(
        cmCTest::DecodeURL(svninfo.URL.substr(svninfo.Root.size())), '/');
    }
    this->Log << "Repository '" << svninfo.LocalPath
              << "' Base = " << svninfo.Base << "\n";
  }

  // Set the global new revision to the one of the root
  this->NewRevision = this->RootInfo->NewRevision;
  return true;
}